

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_widget_at.cpp
# Opt level: O3

bool anon_unknown.dwarf_1c76f1::has_coordinates(Widget *w,size_t global_x,size_t global_y)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  
  if (w->enabled_ == true) {
    sVar1 = (w->top_left_position_).x;
    sVar8 = cppurses::detail::Border_offset::west(w);
    sVar2 = (w->top_left_position_).x;
    sVar9 = cppurses::detail::Border_offset::west(w);
    sVar3 = w->outer_width_;
    sVar10 = cppurses::detail::Border_offset::east(w);
    sVar11 = cppurses::detail::Border_offset::west(w);
    sVar4 = (w->top_left_position_).y;
    sVar12 = cppurses::detail::Border_offset::north(w);
    sVar5 = (w->top_left_position_).y;
    sVar13 = cppurses::detail::Border_offset::north(w);
    sVar6 = w->outer_height_;
    sVar14 = cppurses::detail::Border_offset::north(w);
    sVar15 = cppurses::detail::Border_offset::south(w);
    bVar7 = false;
    if ((sVar8 + sVar1 <= global_x) &&
       (bVar7 = false, global_x < (sVar9 + sVar2 + sVar3) - (sVar10 + sVar11))) {
      bVar7 = sVar12 + sVar4 <= global_y && global_y < (sVar13 + sVar5 + sVar6) - (sVar14 + sVar15);
    }
    return bVar7;
  }
  return false;
}

Assistant:

bool has_coordinates(const cppurses::Widget& w,
                     std::size_t global_x,
                     std::size_t global_y) {
    if (!w.enabled()) {
        return false;
    }
    const bool within_west = global_x >= w.inner_x();
    const bool within_east = global_x < (w.inner_x() + w.width());
    const bool within_north = global_y >= w.inner_y();
    const bool within_south = global_y < (w.inner_y() + w.height());
    return within_west && within_east && within_north && within_south;
}